

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa-generate.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  byte bVar1;
  ostream *poVar2;
  int local_58;
  allocator<char> local_41;
  string local_40 [36];
  int local_1c;
  char **ppcStack_18;
  int bits;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  if (argc < 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"verifyrsa - https://github.com/rodlie/verifyrsa"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Usage: rsa-generate <key suffix> <bits>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 0;
  }
  else {
    if (argc < 3) {
      local_58 = 0x800;
    }
    else {
      local_58 = atoi(argv[2]);
    }
    local_1c = local_58;
    __s = ppcStack_18[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_40,__s,&local_41);
    bVar1 = VerifyRSA::generate(local_40,local_1c);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
    if (((bVar1 ^ 0xff) & 1) == 0) {
      argv_local._4_4_ = 0;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Unable to generate keys!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
    if (argc<2) {
        std::cout << "verifyrsa - https://github.com/rodlie/verifyrsa" << std::endl;
        std::cout << "" << std::endl;
        std::cout << "Usage: rsa-generate <key suffix> <bits>" << std::endl;
        return 0;
    }
    int bits = argc>2?atoi(argv[2]):2048;
    if (!VerifyRSA::generate(argv[1], bits)) {
        std::cerr << "Unable to generate keys!" << std::endl;
        return 1;
    }
    return 0;
}